

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O0

void ImportOneRow(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,int rgb_step,int rgb_bit_depth,
                 int pic_width,fixed_y_t *dst)

{
  uint uVar1;
  int iVar2;
  int shift_00;
  int iVar3;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  long in_stack_00000008;
  int shift;
  int off;
  int w;
  int i;
  int step;
  int local_3c;
  int local_2c;
  
  local_3c = in_ECX;
  if (8 < in_R8D) {
    local_3c = in_ECX / 2;
  }
  local_2c = 0;
  uVar1 = in_R9D + 1 & 0xfffffffe;
  do {
    iVar2 = local_2c * local_3c;
    shift_00 = GetPrecisionShift(in_R8D);
    if (in_R8D == 8) {
      iVar3 = Shift((uint)*(byte *)(in_RDI + iVar2),shift_00);
      *(short *)(in_stack_00000008 + (long)local_2c * 2) = (short)iVar3;
      iVar3 = Shift((uint)*(byte *)(in_RSI + iVar2),shift_00);
      *(short *)(in_stack_00000008 + (long)(int)(local_2c + uVar1) * 2) = (short)iVar3;
      iVar2 = Shift((uint)*(byte *)(in_RDX + iVar2),shift_00);
      *(short *)(in_stack_00000008 + (long)(int)(local_2c + uVar1 * 2) * 2) = (short)iVar2;
    }
    else {
      iVar3 = Shift((uint)*(ushort *)(in_RDI + (long)iVar2 * 2),shift_00);
      *(short *)(in_stack_00000008 + (long)local_2c * 2) = (short)iVar3;
      iVar3 = Shift((uint)*(ushort *)(in_RSI + (long)iVar2 * 2),shift_00);
      *(short *)(in_stack_00000008 + (long)(int)(local_2c + uVar1) * 2) = (short)iVar3;
      iVar2 = Shift((uint)*(ushort *)(in_RDX + (long)iVar2 * 2),shift_00);
      *(short *)(in_stack_00000008 + (long)(int)(local_2c + uVar1 * 2) * 2) = (short)iVar2;
    }
    local_2c = local_2c + 1;
  } while (local_2c < (int)in_R9D);
  if ((in_R9D & 1) != 0) {
    *(undefined2 *)(in_stack_00000008 + (long)(int)in_R9D * 2) =
         *(undefined2 *)(in_stack_00000008 + (long)(int)(in_R9D - 1) * 2);
    *(undefined2 *)(in_stack_00000008 + (long)(int)(in_R9D + uVar1) * 2) =
         *(undefined2 *)(in_stack_00000008 + (long)(int)(in_R9D + uVar1 + -1) * 2);
    *(undefined2 *)(in_stack_00000008 + (long)(int)(in_R9D + uVar1 * 2) * 2) =
         *(undefined2 *)(in_stack_00000008 + (long)(int)(in_R9D + uVar1 * 2 + -1) * 2);
  }
  return;
}

Assistant:

static void ImportOneRow(const uint8_t* const r_ptr,
                         const uint8_t* const g_ptr,
                         const uint8_t* const b_ptr,
                         int rgb_step,
                         int rgb_bit_depth,
                         int pic_width,
                         fixed_y_t* const dst) {
  // Convert the rgb_step from a number of bytes to a number of uint8_t or
  // uint16_t values depending the bit depth.
  const int step = (rgb_bit_depth > 8) ? rgb_step / 2 : rgb_step;
  int i = 0;
  const int w = (pic_width + 1) & ~1;
  do {
    const int off = i * step;
    const int shift = GetPrecisionShift(rgb_bit_depth);
    if (rgb_bit_depth == 8) {
      dst[i + 0 * w] = Shift(r_ptr[off], shift);
      dst[i + 1 * w] = Shift(g_ptr[off], shift);
      dst[i + 2 * w] = Shift(b_ptr[off], shift);
    } else {
      dst[i + 0 * w] = Shift(((uint16_t*)r_ptr)[off], shift);
      dst[i + 1 * w] = Shift(((uint16_t*)g_ptr)[off], shift);
      dst[i + 2 * w] = Shift(((uint16_t*)b_ptr)[off], shift);
    }
  } while (++i < pic_width);
  if (pic_width & 1) {  // replicate rightmost pixel
    dst[pic_width + 0 * w] = dst[pic_width + 0 * w - 1];
    dst[pic_width + 1 * w] = dst[pic_width + 1 * w - 1];
    dst[pic_width + 2 * w] = dst[pic_width + 2 * w - 1];
  }
}